

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall
ASDCP::MXF::PHDRMetadataTrackSubDescriptor::PHDRMetadataTrackSubDescriptor
          (PHDRMetadataTrackSubDescriptor *this,PHDRMetadataTrackSubDescriptor *rhs)

{
  byte_t *value;
  UL local_48;
  PHDRMetadataTrackSubDescriptor *local_18;
  PHDRMetadataTrackSubDescriptor *rhs_local;
  PHDRMetadataTrackSubDescriptor *this_local;
  
  local_18 = rhs;
  rhs_local = this;
  InterchangeObject::InterchangeObject
            (&this->super_InterchangeObject,(rhs->super_InterchangeObject).m_Dict);
  (this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__PHDRMetadataTrackSubDescriptor_0033bd30;
  UL::UL(&this->DataDefinition);
  if ((this->super_InterchangeObject).m_Dict != (Dictionary *)0x0) {
    value = Dictionary::ul((this->super_InterchangeObject).m_Dict,MDD_PHDRMetadataTrackSubDescriptor
                          );
    UL::UL(&local_48,value);
    UL::operator=(&(this->super_InterchangeObject).super_KLVPacket.m_UL,&local_48);
    UL::~UL(&local_48);
    (*(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket[0x12])(this,local_18);
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x13ad,
                "ASDCP::MXF::PHDRMetadataTrackSubDescriptor::PHDRMetadataTrackSubDescriptor(const PHDRMetadataTrackSubDescriptor &)"
               );
}

Assistant:

PHDRMetadataTrackSubDescriptor::PHDRMetadataTrackSubDescriptor(const PHDRMetadataTrackSubDescriptor& rhs) : InterchangeObject(rhs.m_Dict)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_PHDRMetadataTrackSubDescriptor);
  Copy(rhs);
}